

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

int __thiscall
Imf_3_4::Compressor::compress(Compressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  uint64_t uVar1;
  Box<Imath_3_2::Vec2<int>_> *in_RSI;
  Box<Imath_3_2::Vec2<int>_> *in_RDI;
  Box2i range;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffffb0;
  
  Header::dataWindow((Header *)0x18e4bd);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_ffffffffffffffb0,in_RDI);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_RSI,in_RDI);
  uVar1 = runEncodeStep((Compressor *)inPtr,(char *)CONCAT44(inSize,minY),outPtr._4_4_,
                        (Box2i *)range.max,(char **)range.min);
  return (int)uVar1;
}

Assistant:

int
Compressor::compress (
    const char* inPtr, int inSize, int minY, const char*& outPtr)
{
    IMATH_NAMESPACE::Box2i range = _header.dataWindow ();

    range.min.y = minY;
    range.max.y = minY + _numScanLines - 1;

    return static_cast<int> (
        runEncodeStep (inPtr, inSize, range, outPtr));
}